

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O1

int MPIU_Alltoallv(void *sendbuf,int *sendcnts,int *sdispls,MPI_Datatype sendtype,void *recvbuf,
                  int *recvcnts,int *rdispls,MPI_Datatype recvtype,MPI_Comm comm,
                  MPIU_AlltoallvSparsePolicy policy)

{
  MPI_Datatype poVar1;
  void *__ptr;
  int iVar2;
  long lVar3;
  int *__ptr_00;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int *__ptr_01;
  uint uVar8;
  uint uVar9;
  int NTask;
  int NTask_1;
  int ThisTask_1;
  ptrdiff_t recv_elsize;
  ptrdiff_t send_elsize;
  int ThisTask;
  ptrdiff_t lb;
  uint local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  int *local_98;
  MPI_Datatype local_90;
  int *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  long local_50;
  long local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_90 = sendtype;
  local_78 = recvbuf;
  local_70 = sendbuf;
  MPI_Comm_rank(comm,local_3c);
  MPI_Comm_size(comm,&local_a4);
  lVar6 = (long)local_a4;
  if (lVar6 < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (0 < sendcnts[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar6 != lVar3);
    uVar4 = (uint)(0x80 < uVar4);
  }
  if (recvcnts == (int *)0x0) {
    recvcnts = (int *)malloc(lVar6 << 2);
    MPI_Alltoall(sendcnts,1,&ompi_mpi_int,recvcnts,1,&ompi_mpi_int,comm);
    __ptr_01 = recvcnts;
  }
  else {
    __ptr_01 = (int *)0x0;
  }
  if (local_78 == (void *)0x0) {
    if ((long)local_a4 < 1) {
      iVar2 = 0;
    }
    else {
      lVar6 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + recvcnts[lVar6];
        lVar6 = lVar6 + 1;
      } while (local_a4 != lVar6);
    }
  }
  else {
    if (sdispls == (int *)0x0) {
      lVar6 = (long)local_a4;
      __ptr_00 = (int *)malloc(lVar6 * 4);
      *__ptr_00 = 0;
      local_88 = __ptr_00;
      if (1 < lVar6) {
        iVar2 = *__ptr_00;
        lVar3 = 1;
        do {
          iVar2 = iVar2 + sendcnts[lVar3 + -1];
          __ptr_00[lVar3] = iVar2;
          lVar3 = lVar3 + 1;
        } while (lVar6 != lVar3);
      }
    }
    else {
      __ptr_00 = (int *)0x0;
      local_88 = sdispls;
    }
    if (rdispls == (int *)0x0) {
      lVar6 = (long)local_a4;
      local_98 = __ptr_00;
      rdispls = (int *)malloc(lVar6 * 4);
      *rdispls = 0;
      local_60 = rdispls;
      __ptr_00 = local_98;
      if (1 < lVar6) {
        iVar2 = *rdispls;
        lVar3 = 1;
        do {
          iVar2 = iVar2 + recvcnts[lVar3 + -1];
          rdispls[lVar3] = iVar2;
          lVar3 = lVar3 + 1;
        } while (lVar6 != lVar3);
      }
    }
    else {
      local_60 = (int *)0x0;
    }
    if (policy == REQUIRED) {
      local_a8 = 0;
    }
    else if (policy == DISABLED) {
      local_a8 = 1;
    }
    else if (policy == AUTO) {
      local_a8 = uVar4;
      MPI_Allreduce(1,&local_a8,1,&ompi_mpi_int,&ompi_mpi_op_sum,comm);
    }
    if (local_a8 == 0) {
      local_98 = __ptr_00;
      local_68 = __ptr_01;
      local_58 = rdispls;
      MPI_Comm_rank(comm,&local_9c,local_88);
      MPI_Comm_size(comm,&local_a0);
      iVar2 = 0;
      do {
        uVar4 = 1 << ((byte)iVar2 & 0x1f);
        iVar2 = iVar2 + 1;
      } while ((int)uVar4 < local_a0);
      MPI_Type_get_extent(local_90,local_38,&local_48);
      MPI_Type_get_extent(recvtype,local_38,&local_50);
      local_80 = malloc((long)local_a0 << 4);
      iVar7 = 0;
      if (iVar2 != 0x20) {
        uVar9 = 1;
        if (1 < (int)uVar4) {
          uVar9 = uVar4;
        }
        uVar8 = 0;
        iVar7 = 0;
        do {
          uVar5 = local_9c ^ uVar8;
          if ((int)uVar5 < local_a0) {
            if (recvcnts[(int)uVar5] != 0) {
              lVar6 = (long)iVar7;
              iVar7 = iVar7 + 1;
              MPI_Irecv((void *)(local_58[(int)uVar5] * local_50 + (long)local_78),
                        recvcnts[(int)uVar5],recvtype,uVar5,0x18e2e,comm,
                        (void *)((long)local_80 + lVar6 * 8));
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      MPI_Barrier(comm);
      poVar1 = local_90;
      if (iVar2 != 0x20) {
        uVar9 = 1;
        if (1 < (int)uVar4) {
          uVar9 = uVar4;
        }
        uVar4 = 0;
        do {
          uVar8 = local_9c ^ uVar4;
          if ((int)uVar8 < local_a0) {
            if (sendcnts[(int)uVar8] != 0) {
              lVar6 = (long)iVar7;
              iVar7 = iVar7 + 1;
              MPI_Isend((void *)(local_88[(int)uVar8] * local_48 + (long)local_70),
                        sendcnts[(int)uVar8],poVar1,uVar8,0x18e2e,comm,
                        (void *)((long)local_80 + lVar6 * 8));
            }
          }
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      __ptr = local_80;
      iVar2 = 0;
      MPI_Waitall(iVar7,local_80,0);
      free(__ptr);
      MPI_Barrier(comm);
      __ptr_01 = local_68;
      __ptr_00 = local_98;
    }
    else {
      iVar2 = MPI_Alltoallv(local_70,sendcnts,local_88,local_90,local_78,recvcnts,rdispls,recvtype,
                            comm);
    }
    if (local_60 != (int *)0x0) {
      free(local_60);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
  }
  if (__ptr_01 != (int *)0x0) {
    free(__ptr_01);
  }
  return iVar2;
}

Assistant:

int MPIU_Alltoallv(void *sendbuf, int *sendcnts, int *sdispls,
        MPI_Datatype sendtype, void *recvbuf, int *recvcnts,
        int *rdispls, MPI_Datatype recvtype, MPI_Comm comm,
        enum MPIU_AlltoallvSparsePolicy policy
)
/*
 * sdispls, recvcnts rdispls can be NULL,
 *
 * if recvbuf is NULL, returns total number of item required to hold the
 * data.
 * */
{
    int ThisTask;
    int NTask;
    MPI_Comm_rank(comm, &ThisTask);
    MPI_Comm_size(comm, &NTask);
    int i;
    int nn = 0;
    int *a_sdispls=NULL, *a_recvcnts=NULL, *a_rdispls=NULL;
    for(i = 0; i < NTask; i ++) {
        if(sendcnts[i] > 0) {
            nn ++;
        }
    }
    if(recvcnts == NULL) {
        a_recvcnts = malloc(sizeof(int) * NTask);
        recvcnts = a_recvcnts;
        MPI_Alltoall(sendcnts, 1, MPI_INT,
                     recvcnts, 1, MPI_INT, comm);
    }
    if(recvbuf == NULL) {
        int totalrecv = 0;
        for(i = 0; i < NTask; i ++) {
            totalrecv += recvcnts[i];
        }
        if(a_recvcnts)
            free(a_recvcnts);
        return totalrecv;
    }
    if(sdispls == NULL) {
        a_sdispls = malloc(sizeof(int) * NTask);
        sdispls = a_sdispls;
        sdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            sdispls[i] = sdispls[i - 1] + sendcnts[i - 1];
        }
    }
    if(rdispls == NULL) {
        a_rdispls = malloc(sizeof(int) * NTask);
        rdispls = a_rdispls;
        rdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            rdispls[i] = rdispls[i - 1] + recvcnts[i - 1];
        }
    }

    int dense;

    if(policy == AUTO) {
        dense = nn > 128;
        MPI_Allreduce(MPI_IN_PLACE, &dense, 1, MPI_INT, MPI_SUM, comm);
    }
    if(policy == DISABLED) {
        dense = 1;
    }
    if(policy == REQUIRED) {
        dense = 0;
    }

    int ret;
    if(dense != 0) {
        ret = MPI_Alltoallv(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    } else {
        ret = MPI_Alltoallv_sparse(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    }

    if(a_rdispls)
        free(a_rdispls);
    if(a_sdispls)
        free(a_sdispls);
    if(a_recvcnts)
        free(a_recvcnts);
    return ret;
}